

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

string * __thiscall
cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
          (string *__return_storage_ptr__,cmLocalUnixMakefileGenerator3 *this,char *makefile,
          string *tgt)

{
  string *psVar1;
  ulong uVar2;
  char *pcVar3;
  string local_118;
  string local_f8;
  allocator local_d1;
  string local_d0;
  undefined1 local_b0 [8];
  string tgt2;
  cmGlobalUnixMakefileGenerator3 *gg;
  string local_80;
  string local_60;
  undefined1 local_29;
  string *local_28;
  string *tgt_local;
  char *makefile_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  string *cmd;
  
  local_29 = 0;
  local_28 = tgt;
  tgt_local = (string *)makefile;
  makefile_local = (char *)this;
  this_local = (cmLocalUnixMakefileGenerator3 *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"$(MAKE) -f ");
  psVar1 = tgt_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,(char *)psVar1,(allocator *)((long)&gg + 7));
  cmOutputConverter::ConvertToOutputFormat
            (&local_60,
             &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             &local_80,SHELL);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gg + 7));
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ");
  tgt2.field_2._8_8_ = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,(string *)(tgt2.field_2._8_8_ + 0x10));
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ");
  }
  if ((*(byte *)(tgt2.field_2._8_8_ + 0x5e9) & 1) != 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"-$(MAKEFLAGS) ");
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    pcVar3 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d0,pcVar3,&local_d1);
    MaybeConvertToRelativePath((string *)local_b0,this,&local_d0,local_28);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    cmSystemTools::ConvertToOutputSlashes((string *)local_b0);
    if ((this->MakeCommandEscapeTargetTwice & 1U) != 0) {
      cmOutputConverter::EscapeForShell
                (&local_f8,
                 &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,(string *)local_b0,true,false,false);
      std::__cxx11::string::operator=((string *)local_b0,(string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
    }
    cmOutputConverter::EscapeForShell
              (&local_118,
               &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
               (string *)local_b0,true,false,false);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall(
  const char* makefile, const std::string& tgt)
{
  // Call make on the given file.
  std::string cmd;
  cmd += "$(MAKE) -f ";
  cmd += this->ConvertToOutputFormat(makefile, cmOutputConverter::SHELL);
  cmd += " ";

  cmGlobalUnixMakefileGenerator3* gg =
    static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
  // Pass down verbosity level.
  if (!gg->MakeSilentFlag.empty()) {
    cmd += gg->MakeSilentFlag;
    cmd += " ";
  }

  // Most unix makes will pass the command line flags to make down to
  // sub-invoked makes via an environment variable.  However, some
  // makes do not support that, so you have to pass the flags
  // explicitly.
  if (gg->PassMakeflags) {
    cmd += "-$(MAKEFLAGS) ";
  }

  // Add the target.
  if (!tgt.empty()) {
    // The make target is always relative to the top of the build tree.
    std::string tgt2 =
      this->MaybeConvertToRelativePath(this->GetBinaryDirectory(), tgt);

    // The target may have been written with windows paths.
    cmSystemTools::ConvertToOutputSlashes(tgt2);

    // Escape one extra time if the make tool requires it.
    if (this->MakeCommandEscapeTargetTwice) {
      tgt2 = this->EscapeForShell(tgt2, true, false);
    }

    // The target name is now a string that should be passed verbatim
    // on the command line.
    cmd += this->EscapeForShell(tgt2, true, false);
  }
  return cmd;
}